

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall
sfc::Map::add(Map *this,Image *image,Tileset *tileset,Palette *palette,uint bpp,uint pos_x,
             uint pos_y)

{
  pointer pMVar1;
  pointer pMVar2;
  TileFlipped TVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  runtime_error *this_00;
  pointer ppSVar8;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> spv;
  Tile local_178;
  Image remapped_image;
  Tile remapped_tile;
  
  lVar7 = (long)(this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(lVar7 / 0xc) < (ulong)(this->_map_width * pos_y + pos_x)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10,0xc,lVar7 % 0xc);
    std::runtime_error::runtime_error(this_00,"Map entry out of bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_178._mode = snes;
  local_178._bpp = 4;
  local_178._width = 8;
  local_178._height = 8;
  local_178._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._mirrors.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._mirrors.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._mirrors.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Palette::subpalettes_matching(&spv,palette,image);
  uVar5 = 0xffffffff;
  ppSVar8 = spv.
            super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppSVar8 ==
        spv.super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar4 = 0xffffffff;
      break;
    }
    Image::Image(&remapped_image,image,*ppSVar8);
    Tile::Tile(&remapped_tile,&remapped_image,this->_mode,bpp,true);
    uVar4 = Tileset::index_of(tileset,&remapped_tile);
    if (uVar4 != 0xffffffff) {
      uVar5 = Palette::index_of(palette,*ppSVar8);
      Tile::operator=(&local_178,&remapped_tile);
    }
    Tile::~Tile(&remapped_tile);
    Image::~Image(&remapped_image);
    ppSVar8 = ppSVar8 + 1;
  } while (uVar4 == 0xffffffff);
  std::_Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>::
  ~_Vector_base(&spv.
                 super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
               );
  if (uVar4 == 0xffffffff) {
    remapped_image._0_8_ = ZEXT48(image->_src_coord_x);
    remapped_image._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(ulong)image->_src_coord_y;
    fmt.size_ = 0x26;
    fmt.data_ = "  No matching tile for position {},{}\n";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&remapped_image;
    args.desc_ = 0x22;
    ::fmt::v10::vprint(_stderr,fmt,args);
  }
  else {
    uVar6 = max_tile_count_for_mode(this->_mode);
    if ((int)uVar4 < (int)uVar6) {
      TVar3 = Tile::is_flipped((tileset->_tiles).
                               super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                               super__Vector_impl_data._M_start + (int)uVar4,&local_178);
      uVar6 = pos_y * this->_map_width + pos_x;
      pMVar1 = (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar1[uVar6].tile_index = uVar4;
      pMVar1[uVar6].palette_index = uVar5;
      pMVar1[uVar6].flip_h = (bool)(TVar3.h & 1);
      pMVar1[uVar6].flip_v = (bool)(TVar3.v & 1);
      goto LAB_0012f7b4;
    }
    remapped_image._0_8_ = ZEXT48(image->_src_coord_x);
    remapped_image._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(ulong)image->_src_coord_y;
    fmt_00.size_ = 0x3a;
    fmt_00.data_ = "  Mapped tile exceeds allowed map index at position {},{}\n";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&remapped_image;
    args_00.desc_ = 0x22;
    ::fmt::v10::vprint(_stderr,fmt_00,args_00);
  }
  uVar5 = pos_y * this->_map_width + pos_x;
  pMVar1 = (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2 = pMVar1 + uVar5;
  pMVar2->flip_h = false;
  pMVar2->flip_v = false;
  pMVar1 = pMVar1 + uVar5;
  pMVar1->tile_index = 0;
  pMVar1->palette_index = 0;
LAB_0012f7b4:
  Tile::~Tile(&local_178);
  return;
}

Assistant:

void Map::add(const sfc::Image& image, const sfc::Tileset& tileset, const sfc::Palette& palette, unsigned bpp, unsigned pos_x, unsigned pos_y) {
  if (((pos_y * _map_width) + pos_x) > _entries.size())
    throw std::runtime_error("Map entry out of bounds");

  int tileset_index = -1;
  int palette_index = -1;
  Tile matched_tile;
  {
    // search all viable palette mappings of image in tileset
    const auto spv = palette.subpalettes_matching(image);
    for (const auto& p : spv) {
      const Image remapped_image = Image(image, *p);
      Tile remapped_tile(remapped_image, _mode, bpp, true);
      tileset_index = tileset.index_of(remapped_tile);
      if (tileset_index != -1) {
        palette_index = palette.index_of(*p);
        matched_tile = remapped_tile;
        break;
      }
    }
  }

  if (tileset_index == -1) {
    fmt::print(stderr, "  No matching tile for position {},{}\n", image.src_coord_x(), image.src_coord_y());
    _entries[(pos_y * _map_width) + pos_x] = Mapentry(0, 0, false, false);

  } else if (tileset_index >= (int)max_tile_count_for_mode(_mode)) {
    fmt::print(stderr, "  Mapped tile exceeds allowed map index at position {},{}\n", image.src_coord_x(), image.src_coord_y());
    _entries[(pos_y * _map_width) + pos_x] = Mapentry(0, 0, false, false);

  } else {
    const TileFlipped flipped = tileset.tiles()[tileset_index].is_flipped(matched_tile);
    _entries[(pos_y * _map_width) + pos_x] =
      Mapentry(tileset_index, palette_index, flipped.h, flipped.v);
  }
}